

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall
ON_SubDMeshFragmentIterator::FirstFragment(ON_SubDMeshFragmentIterator *this)

{
  ON_SubDMeshFragment *pOVar1;
  ON_SubDFace *local_18;
  ON_SubDFace *f;
  ON_SubDMeshFragmentIterator *this_local;
  
  if ((this->m_bFromFaceFragments & 1U) == 0) {
    pOVar1 = ON_SubDMesh::FirstFragment(&this->m_limit_mesh);
    this->m_current_fragment = pOVar1;
  }
  else {
    this->m_current_fragment = (ON_SubDMeshFragment *)0x0;
    local_18 = ON_SubDFaceIterator::FirstFace(&this->m_fit);
    while (local_18 != (ON_SubDFace *)0x0) {
      pOVar1 = ON_SubDFace::MeshFragments(local_18);
      this->m_current_fragment = pOVar1;
      if (this->m_current_fragment != (ON_SubDMeshFragment *)0x0) break;
      local_18 = ON_SubDFaceIterator::NextFace(&this->m_fit);
    }
  }
  return this->m_current_fragment;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragmentIterator::FirstFragment()
{
  if (m_bFromFaceFragments)
  {
    m_current_fragment = nullptr;
    for (const ON_SubDFace* f = m_fit.FirstFace(); nullptr != f; f = m_fit.NextFace())
    {
      m_current_fragment = f->MeshFragments();
      if (nullptr != m_current_fragment)
        break;
    }
  }
  else
  {
    m_current_fragment = m_limit_mesh.FirstFragment();
  }
  return m_current_fragment;
}